

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

bool __thiscall
InsertProxyModel::setItemData(InsertProxyModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Int IVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  int *piVar9;
  const_iterator __first;
  const_iterator __last;
  QVariant *pQVar10;
  QVariant *pQVar11;
  RolesContainer *local_260;
  int local_254;
  bool local_233;
  bool local_232;
  bool local_231;
  bool local_219;
  int local_210;
  char local_20c [4];
  const_iterator local_208;
  int local_1fc;
  const_iterator local_1f8;
  const_iterator editIter_1;
  const_iterator local_1e8;
  int local_1dc;
  const_iterator local_1d8;
  const_iterator displayIter_1;
  int local_1c4;
  iterator local_1c0;
  iterator local_1b8;
  const_iterator local_1b0;
  iterator local_1a8;
  const_iterator local_1a0;
  int local_194;
  iterator local_190;
  iterator editIter;
  const_iterator local_180;
  const_iterator displayIter;
  ItemDataRole local_15c;
  bool hasEdit;
  const_iterator cStack_158;
  const_iterator local_150;
  byte local_145;
  undefined4 local_144;
  bool hasDisplay;
  iterator iStack_140;
  const_iterator local_138;
  iterator local_130;
  iterator local_128;
  iterator local_120;
  iterator oldDataIter;
  const_iterator local_100;
  const_iterator i;
  QVector<int> changedRoles;
  RolesContainer *dataContainer;
  int sectionIdx;
  undefined1 local_b8 [24];
  Int local_a0;
  bool local_99;
  Int local_98;
  bool isExtraCol;
  QFlags<InsertProxyModel::InsertDirection> local_90;
  QFlags<InsertProxyModel::InsertDirection> QStack_8c;
  bool isExtraRow;
  QModelIndex local_88;
  InsertProxyModelPrivate *local_70;
  InsertProxyModelPrivate *d;
  int local_4c;
  int sourceCols;
  int local_2c;
  QMap<int,_QVariant> *pQStack_28;
  int sourceRows;
  QMap<int,_QVariant> *roles_local;
  QModelIndex *index_local;
  InsertProxyModel *this_local;
  
  pQStack_28 = roles;
  roles_local = (QMap<int,_QVariant> *)index;
  index_local = (QModelIndex *)this;
  bVar1 = QModelIndex::isValid(index);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_00184612;
  }
  lVar6 = QAbstractProxyModel::sourceModel();
  if (lVar6 == 0) {
    this_local._7_1_ = 0;
    goto LAB_00184612;
  }
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffb8);
  local_2c = (**(code **)(*plVar7 + 0x78))(plVar7,&stack0xffffffffffffffb8);
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex((QModelIndex *)&d);
  local_4c = (**(code **)(*plVar7 + 0x80))(plVar7,&d);
  local_70 = d_func(this);
  QModelIndex::parent(&local_88,(QModelIndex *)roles_local);
  bVar1 = QModelIndex::isValid(&local_88);
  local_219 = true;
  if (!bVar1) {
    iVar3 = QModelIndex::row((QModelIndex *)roles_local);
    local_219 = true;
    if (iVar3 <= local_2c) {
      iVar3 = QModelIndex::column((QModelIndex *)roles_local);
      local_219 = true;
      if (iVar3 <= local_4c) {
        iVar3 = QModelIndex::row((QModelIndex *)roles_local);
        if (iVar3 == local_2c) {
          QStack_8c = QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_70->m_insertDirection,InsertRow);
          bVar1 = QFlags<InsertProxyModel::InsertDirection>::operator!(&stack0xffffffffffffff74);
          local_219 = true;
          if (bVar1) goto LAB_00183a4e;
        }
        iVar3 = QModelIndex::column((QModelIndex *)roles_local);
        local_231 = false;
        if (iVar3 == local_4c) {
          local_90 = QFlags<InsertProxyModel::InsertDirection>::operator&
                               (&local_70->m_insertDirection,InsertColumn);
          local_231 = QFlags<InsertProxyModel::InsertDirection>::operator!(&local_90);
        }
        local_219 = local_231;
      }
    }
  }
LAB_00183a4e:
  if (local_219 == false) {
    iVar3 = QModelIndex::row((QModelIndex *)roles_local);
    local_232 = false;
    if (iVar3 == local_2c) {
      local_98 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_70->m_insertDirection,InsertRow);
      IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_98);
      local_232 = IVar4 != 0;
    }
    isExtraCol = local_232;
    iVar3 = QModelIndex::column((QModelIndex *)roles_local);
    local_233 = false;
    if (iVar3 == local_4c) {
      local_a0 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                (&local_70->m_insertDirection,InsertColumn);
      IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a0);
      local_233 = IVar4 != 0;
    }
    local_99 = local_233;
    if (((isExtraCol & 1U) == 0) && (local_233 == false)) {
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      iVar3 = QModelIndex::row((QModelIndex *)roles_local);
      iVar5 = QModelIndex::column((QModelIndex *)roles_local);
      QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff30);
      (**(code **)(*plVar8 + 0x60))(local_b8,plVar8,iVar3,iVar5,&stack0xffffffffffffff30);
      bVar2 = (**(code **)(*plVar7 + 0xb8))(plVar7,local_b8,pQStack_28);
      this_local._7_1_ = bVar2 & 1;
    }
    else {
      if ((isExtraCol & 1U) == 0) {
        local_254 = QModelIndex::row((QModelIndex *)roles_local);
      }
      else {
        local_254 = QModelIndex::column((QModelIndex *)roles_local);
      }
      if (((isExtraCol & 1U) == 0) || ((local_99 & 1U) == 0)) {
        local_260 = QList<QMap<int,_QVariant>_>::operator[]
                              (local_70->m_extraData + (isExtraCol & 1),(long)local_254);
      }
      else {
        local_260 = &local_70->m_dataForCorner;
      }
      QList<int>::QList((QList<int> *)&i);
      local_100._M_node = (_Base_ptr)QMap<int,_QVariant>::cbegin(pQStack_28);
      while( true ) {
        oldDataIter.i._M_node = (iterator)QMap<int,_QVariant>::cend(pQStack_28);
        bVar1 = ::operator!=((const_iterator *)&local_100,(const_iterator *)&oldDataIter);
        if (!bVar1) break;
        pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
        bVar1 = ::QVariant::isValid(pQVar10);
        if (bVar1) {
          piVar9 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)&local_100);
          local_120._M_node = (_Base_ptr)QMap<int,_QVariant>::find(local_260,piVar9);
          local_128._M_node = (_Base_ptr)QMap<int,_QVariant>::end(local_260);
          bVar1 = ::operator==((iterator *)&local_120,(iterator *)&local_128);
          if (bVar1) {
            pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
            bVar1 = ::QVariant::isValid(pQVar10);
            if (bVar1) {
              piVar9 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)&local_100);
              QList<int>::operator<<((QList<int> *)&i,*piVar9);
              piVar9 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)&local_100);
              pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
              local_130._M_node = (_Base_ptr)QMap<int,_QVariant>::insert(local_260,piVar9,pQVar10);
            }
          }
          else {
            pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
            bVar1 = ::QVariant::isValid(pQVar10);
            if (bVar1) {
              pQVar10 = QMap<int,_QVariant>::iterator::value((iterator *)&local_120);
              pQVar11 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
              bVar1 = ::operator!=(pQVar10,pQVar11);
              if (bVar1) {
                piVar9 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)&local_100);
                QList<int>::operator<<((QList<int> *)&i,*piVar9);
                pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_100);
                pQVar11 = QMap<int,_QVariant>::iterator::value((iterator *)&local_120);
                ::QVariant::operator=(pQVar11,(QVariant *)pQVar10);
              }
            }
            else {
              piVar9 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)&local_100);
              QList<int>::operator<<((QList<int> *)&i,*piVar9);
              QMap<int,_QVariant>::const_iterator::const_iterator(&local_138,(iterator *)&local_120)
              ;
              iStack_140._M_node = (_Base_ptr)QMap<int,_QVariant>::erase(local_260,local_138);
            }
          }
        }
        QMap<int,_QVariant>::const_iterator::operator++((const_iterator *)&local_100);
      }
      bVar1 = QList<int>::isEmpty((QList<int> *)&i);
      if (!bVar1) {
        local_150 = QList<int>::cbegin((QList<int> *)&i);
        cStack_158 = QList<int>::cend((QList<int> *)&i);
        local_15c = DisplayRole;
        local_145 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                              (local_150,cStack_158,&local_15c);
        __first = QList<int>::cbegin((QList<int> *)&i);
        __last = QList<int>::cend((QList<int> *)&i);
        displayIter.i._M_node._4_4_ = 2;
        bVar1 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                          (__first,__last,(ItemDataRole *)((long)&displayIter.i._M_node + 4));
        if ((local_70->m_separateEditDisplay & 1U) == 0) {
          if (((local_145 & 1) == 0) || (!bVar1)) {
            if ((bool)(local_145 & 1) != bVar1) {
              if ((local_145 & 1) == 0) {
                local_1fc = 2;
                local_1f8._M_node = (_Base_ptr)QMap<int,_QVariant>::constFind(local_260,&local_1fc);
                local_208._M_node = (_Base_ptr)QMap<int,_QVariant>::constEnd(local_260);
                bVar1 = ::operator==((const_iterator *)&local_1f8,(const_iterator *)&local_208);
                if (bVar1) {
                  local_20c[0] = '\0';
                  local_20c[1] = '\0';
                  local_20c[2] = '\0';
                  local_20c[3] = '\0';
                  QMap<int,_QVariant>::remove(local_260,local_20c);
                }
                else {
                  pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_1f8)
                  ;
                  local_210 = 0;
                  pQVar11 = QMap<int,_QVariant>::operator[](local_260,&local_210);
                  ::QVariant::operator=(pQVar11,(QVariant *)pQVar10);
                }
                QList<int>::operator<<((QList<int> *)&i,0);
              }
              else {
                local_1dc = 0;
                local_1d8._M_node = (_Base_ptr)QMap<int,_QVariant>::constFind(local_260,&local_1dc);
                local_1e8._M_node = (_Base_ptr)QMap<int,_QVariant>::constEnd(local_260);
                bVar1 = ::operator==((const_iterator *)&local_1d8,(const_iterator *)&local_1e8);
                if (bVar1) {
                  editIter_1.i._M_node._4_4_ = 2;
                  QMap<int,_QVariant>::remove(local_260,(char *)((long)&editIter_1.i._M_node + 4));
                }
                else {
                  pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_1d8)
                  ;
                  editIter_1.i._M_node._0_4_ = 2;
                  pQVar11 = QMap<int,_QVariant>::operator[](local_260,(int *)&editIter_1);
                  ::QVariant::operator=(pQVar11,(QVariant *)pQVar10);
                }
                QList<int>::operator<<((QList<int> *)&i,2);
              }
            }
          }
          else {
            editIter.i._M_node._4_4_ = 0;
            local_180._M_node =
                 (_Base_ptr)
                 QMap<int,_QVariant>::constFind(local_260,(int *)((long)&editIter.i._M_node + 4));
            local_194 = 2;
            local_190._M_node = (_Base_ptr)QMap<int,_QVariant>::find(local_260,&local_194);
            local_1a0._M_node = (_Base_ptr)QMap<int,_QVariant>::cend(local_260);
            bVar1 = ::operator==((const_iterator *)&local_180,(const_iterator *)&local_1a0);
            if (bVar1) {
              local_1a8._M_node = (_Base_ptr)QMap<int,_QVariant>::end(local_260);
              bVar1 = ::operator!=((iterator *)&local_190,(iterator *)&local_1a8);
              if (bVar1) {
                QMap<int,_QVariant>::const_iterator::const_iterator
                          (&local_1b0,(iterator *)&local_190);
                local_1b8._M_node = (_Base_ptr)QMap<int,_QVariant>::erase(local_260,local_1b0);
              }
            }
            else {
              local_1c0._M_node = (_Base_ptr)QMap<int,_QVariant>::end(local_260);
              bVar1 = ::operator==((iterator *)&local_190,(iterator *)&local_1c0);
              if (bVar1) {
                local_1c4 = 2;
                pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_180);
                displayIter_1.i._M_node =
                     (const_iterator)QMap<int,_QVariant>::insert(local_260,&local_1c4,pQVar10);
              }
              else {
                pQVar10 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)&local_180);
                pQVar11 = QMap<int,_QVariant>::iterator::value((iterator *)&local_190);
                ::QVariant::operator=(pQVar11,(QVariant *)pQVar10);
              }
            }
          }
        }
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)this,(QModelIndex *)roles_local,(QList_conflict2 *)roles_local);
        extraDataChanged(this,(QModelIndex *)roles_local,(QModelIndex *)roles_local,
                         (QVector<int> *)&i);
      }
      this_local._7_1_ = 1;
      local_144 = 1;
      QList<int>::~QList((QList<int> *)&i);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00184612:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InsertProxyModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;
    if (!sourceModel())
        return false;
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return false;
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->setItemData(sourceModel()->index(index.row(), index.column()), roles);

    const int sectionIdx = isExtraRow ? index.column() : index.row();
    RolesContainer *const dataContainer = (isExtraRow && isExtraCol) ? &d->m_dataForCorner : &d->m_extraData[isExtraRow][sectionIdx];
    QVector<int> changedRoles;
    for (auto i = roles.cbegin(); i != roles.cend(); ++i) {
        if (i.value().isValid()) {
            const auto oldDataIter = dataContainer->find(i.key());
            if (oldDataIter == dataContainer->end()) {
                if (i.value().isValid()) {
                    changedRoles << i.key();
                    dataContainer->insert(i.key(), i.value());
                }
            } else if (!i.value().isValid()) {
                changedRoles << i.key();
                dataContainer->erase(oldDataIter);
                continue;
            } else if (oldDataIter.value() != i.value()) {
                changedRoles << i.key();
                oldDataIter.value() = i.value();
            }
        }
    }
    if (changedRoles.isEmpty())
        return true;
    Q_ASSERT(std::is_sorted(changedRoles.cbegin(), changedRoles.cend()));
    const bool hasDisplay = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::DisplayRole);
    const bool hasEdit = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::EditRole);
    if (!d->m_separateEditDisplay) {
        if (hasDisplay && hasEdit) {
            const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
            const auto editIter = dataContainer->find(Qt::EditRole);
            // in QStandardItemModel DisplayRole wins over EditRole so we do the same
            if (displayIter == dataContainer->cend()) {
                if (editIter != dataContainer->end()) {
                    dataContainer->erase(editIter);
                }
            } else {
                if (editIter == dataContainer->end())
                    dataContainer->insert(Qt::EditRole, displayIter.value());
                else
                    editIter.value() = displayIter.value(); // assign without checking should optimise memory use due to implicit sharing
            }
        } else if (hasDisplay != hasEdit) {
            if (hasDisplay) {
                const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
                if (displayIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::EditRole));
                    dataContainer->remove(Qt::EditRole);
                } else {
                    dataContainer->operator[](Qt::EditRole) = displayIter.value();
                }
                changedRoles << Qt::EditRole;
            } else {
                const auto editIter = dataContainer->constFind(Qt::EditRole);
                if (editIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::DisplayRole));
                    dataContainer->remove(Qt::DisplayRole);
                } else {
                    dataContainer->operator[](Qt::DisplayRole) = editIter.value();
                }
                changedRoles << Qt::DisplayRole;
            }
        }
    }
    Q_EMIT dataChanged(index, index, changedRoles);
    Q_EMIT extraDataChanged(index, index, changedRoles);
    return true;
}